

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mspace_realloc_in_place(mspace msp,void *oldmem,size_t bytes)

{
  int *piVar1;
  mchunkptr pmVar2;
  undefined8 local_50;
  mchunkptr newp;
  mstate m;
  mchunkptr oldp;
  size_t nb;
  void *mem;
  size_t bytes_local;
  void *oldmem_local;
  mspace msp_local;
  
  nb = 0;
  if (oldmem != (void *)0x0) {
    if (bytes < 0xffffffffffffff80) {
      if (bytes < 0x17) {
        local_50 = 0x20;
      }
      else {
        local_50 = bytes + 0x17 & 0xfffffffffffffff0;
      }
      pmVar2 = try_realloc_chunk((mstate)msp,(mchunkptr)((long)oldmem + -0x10),local_50,0);
      if (pmVar2 == (mchunkptr)((long)oldmem + -0x10)) {
        nb = (size_t)oldmem;
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0xc;
    }
  }
  return (void *)nb;
}

Assistant:

void* mspace_realloc_in_place(mspace msp, void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = (mstate)msp;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      (void)msp; /* placate people compiling -Wunused */
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}